

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O1

CornerList * av1_alloc_corner_list(void)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)aom_calloc(1,0x8030);
  if (__mutex == (pthread_mutex_t *)0x0) {
    __mutex = (pthread_mutex_t *)0x0;
  }
  else {
    __mutex[1].__size[0] = '\0';
    pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  }
  return (CornerList *)__mutex;
}

Assistant:

CornerList *av1_alloc_corner_list(void) {
  CornerList *corners = (CornerList *)aom_calloc(1, sizeof(*corners));
  if (!corners) {
    return NULL;
  }

  corners->valid = false;
#if CONFIG_MULTITHREAD
  pthread_mutex_init(&corners->mutex, NULL);
#endif  // CONFIG_MULTITHREAD
  return corners;
}